

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::ttimpl::softmax_gradient
               (long num_locations,long num_channels,tensor *grad,tensor *dest,
               tensor *gradient_input,operation_mode mode)

{
  undefined1 auVar1 [16];
  bool bVar2;
  enable_if_t<std::is_convertible<tensor_*,_tensor_*>::value____std::is_convertible<tensor_*,_tensor_*>::value,_bool>
  eVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  undefined8 uVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  longlong lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long *in_RCX;
  tensor *in_RDX;
  long in_RSI;
  long in_RDI;
  tensor *in_R8;
  int in_R9D;
  long idx_2;
  long c_2;
  long idx_1;
  long c_1;
  long idx;
  long c;
  float sum_1;
  long r;
  float *in_channel;
  float *g_channel;
  float *d_channel;
  long k_3;
  long k_2;
  long k_1;
  long k;
  float sum;
  float *in3;
  float *g3;
  float *d3;
  long i;
  float *in2;
  float *g2;
  float *d2;
  long n;
  float *in;
  float *g;
  float *d;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffac0;
  tensor *in_stack_fffffffffffffac8;
  error_type eVar17;
  long lVar16;
  tensor *in_stack_fffffffffffffad0;
  long local_458;
  long local_450;
  long local_448;
  long local_440;
  long local_438;
  long local_430;
  float local_424;
  long local_420;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  float local_3dc;
  long local_3c0;
  long local_3a0;
  ostringstream local_358 [383];
  undefined1 local_1d9;
  ostringstream local_1a8 [380];
  int local_2c;
  tensor *local_28;
  long *local_20;
  tensor *local_18;
  long local_10;
  long local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar2 = have_same_dimensions(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  if (!bVar2) {
    dlib_assert_breakpoint();
    eVar17 = (error_type)((ulong)in_stack_fffffffffffffac8 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"\n\nError detected at line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x6aa);
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)local_1a8,"Error detected in file ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar6,".\n");
    poVar6 = std::operator<<((ostream *)local_1a8,"Error detected in function ");
    poVar6 = std::operator<<(poVar6,
                             "void dlib::cpu::ttimpl::softmax_gradient(const long, const long, tensor &, const tensor &, const tensor &, operation_mode)"
                            );
    std::operator<<(poVar6,".\n\n");
    poVar6 = std::operator<<((ostream *)local_1a8,"Failing expression was ");
    poVar6 = std::operator<<(poVar6,"have_same_dimensions(grad, dest)");
    std::operator<<(poVar6,".\n");
    poVar6 = (ostream *)std::ostream::operator<<(local_1a8,std::boolalpha);
    poVar6 = std::operator<<(poVar6,"");
    std::operator<<(poVar6,"\n");
    local_1d9 = 1;
    uVar7 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffffad0,eVar17,in_stack_fffffffffffffac0);
    local_1d9 = 0;
    __cxa_throw(uVar7,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  bVar2 = have_same_dimensions(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  eVar17 = (error_type)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  if (bVar2) {
    lVar8 = (**(code **)(*local_20 + 0x10))();
    iVar4 = (*local_18->_vptr_tensor[3])();
    iVar5 = (*local_28->_vptr_tensor[2])();
    for (local_3a0 = 0; lVar9 = tensor::num_samples(local_18), local_3a0 < lVar9;
        local_3a0 = local_3a0 + 1) {
      lVar10 = lVar8 + local_8 * local_10 * local_3a0 * 4;
      lVar11 = CONCAT44(extraout_var,iVar4) + local_8 * local_10 * local_3a0 * 4;
      lVar12 = CONCAT44(extraout_var_00,iVar5) + local_8 * local_10 * local_3a0 * 4;
      if (local_2c == 0) {
        for (local_3c0 = 0; local_3c0 < local_8; local_3c0 = local_3c0 + 1) {
          lVar13 = lVar10 + local_3c0 * 4;
          lVar14 = lVar11 + local_3c0 * 4;
          lVar15 = lVar12 + local_3c0 * 4;
          local_3dc = 0.0;
          for (local_3e8 = 0; local_3e8 < local_10; local_3e8 = local_3e8 + 1) {
            auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar15 + local_3e8 * local_8 * 4)),
                                     ZEXT416(*(uint *)(lVar13 + local_3e8 * local_8 * 4) ^
                                             0x80000000),ZEXT416((uint)local_3dc));
            local_3dc = auVar1._0_4_;
          }
          eVar3 = is_same_object<dlib::tensor,dlib::tensor>(local_28,local_18);
          if (eVar3) {
            for (local_3f0 = 0; local_3f0 < local_10; local_3f0 = local_3f0 + 1) {
              *(float *)(lVar14 + local_3f0 * local_8 * 4) =
                   *(float *)(lVar13 + local_3f0 * local_8 * 4) *
                   (local_3dc + *(float *)(lVar15 + local_3f0 * local_8 * 4));
            }
          }
          else {
            for (local_3f8 = 0; local_3f8 < local_10; local_3f8 = local_3f8 + 1) {
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)(local_3dc +
                                                     *(float *)(lVar15 + local_3f8 * local_8 * 4))),
                                       ZEXT416(*(uint *)(lVar13 + local_3f8 * local_8 * 4)),
                                       ZEXT416(*(uint *)(lVar14 + local_3f8 * local_8 * 4)));
              *(int *)(lVar14 + local_3f8 * local_8 * 4) = auVar1._0_4_;
            }
          }
        }
      }
      else if (local_2c == 1) {
        for (local_400 = 0; local_400 < local_10; local_400 = local_400 + 1) {
          lVar13 = lVar10 + local_400 * local_8 * 4;
          lVar14 = lVar11 + local_400 * local_8 * 4;
          lVar15 = lVar12 + local_400 * local_8 * 4;
          for (local_420 = 0; lVar9 = tensor::nr(local_18), local_420 < lVar9;
              local_420 = local_420 + 1) {
            local_424 = 0.0;
            local_430 = 0;
            local_438 = local_420;
            lVar9 = tensor::nc(local_18);
            local_438 = local_438 * lVar9;
            while (lVar16 = local_430, lVar9 = tensor::nc(local_18), lVar16 < lVar9) {
              auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar15 + local_438 * 4)),
                                       ZEXT416(*(uint *)(lVar13 + local_438 * 4) ^ 0x80000000),
                                       ZEXT416((uint)local_424));
              local_424 = auVar1._0_4_;
              local_430 = local_430 + 1;
              local_438 = local_438 + 1;
            }
            eVar3 = is_same_object<dlib::tensor,dlib::tensor>(local_28,local_18);
            if (eVar3) {
              local_440 = 0;
              local_448 = local_420;
              lVar9 = tensor::nc(local_18);
              local_448 = local_448 * lVar9;
              for (; lVar9 = tensor::nc(local_18), local_440 < lVar9; local_440 = local_440 + 1) {
                *(float *)(lVar14 + local_448 * 4) =
                     *(float *)(lVar13 + local_448 * 4) *
                     (local_424 + *(float *)(lVar15 + local_448 * 4));
                local_448 = local_448 + 1;
              }
            }
            else {
              local_450 = 0;
              lVar9 = tensor::nc(local_18);
              local_458 = local_420 * lVar9;
              for (; lVar9 = tensor::nc(local_18), local_450 < lVar9; local_450 = local_450 + 1) {
                auVar1 = vfmadd213ss_fma(ZEXT416((uint)(local_424 +
                                                       *(float *)(lVar15 + local_458 * 4))),
                                         ZEXT416(*(uint *)(lVar13 + local_458 * 4)),
                                         ZEXT416(*(uint *)(lVar14 + local_458 * 4)));
                *(int *)(lVar14 + local_458 * 4) = auVar1._0_4_;
                local_458 = local_458 + 1;
              }
            }
          }
        }
      }
    }
    return;
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_358);
  poVar6 = std::operator<<((ostream *)local_358,"\n\nError detected at line ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x6ab);
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<((ostream *)local_358,"Error detected in file ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<((ostream *)local_358,"Error detected in function ");
  poVar6 = std::operator<<(poVar6,
                           "void dlib::cpu::ttimpl::softmax_gradient(const long, const long, tensor &, const tensor &, const tensor &, operation_mode)"
                          );
  std::operator<<(poVar6,".\n\n");
  poVar6 = std::operator<<((ostream *)local_358,"Failing expression was ");
  poVar6 = std::operator<<(poVar6,"have_same_dimensions(grad, gradient_input)");
  std::operator<<(poVar6,".\n");
  poVar6 = (ostream *)std::ostream::operator<<(local_358,std::boolalpha);
  poVar6 = std::operator<<(poVar6,"");
  std::operator<<(poVar6,"\n");
  uVar7 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error
            ((fatal_error *)in_stack_fffffffffffffad0,eVar17,in_stack_fffffffffffffac0);
  __cxa_throw(uVar7,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void softmax_gradient(
                const long num_locations,
                const long num_channels,
                tensor& grad,
                const tensor& dest,
                const tensor& gradient_input,
                operation_mode mode = operation_mode::CHANNEL_WISE
            )
            {
                DLIB_ASSERT(num_channels * num_locations == grad.nr() * grad.nc() * grad.k());
                DLIB_CASSERT(have_same_dimensions(grad, dest));
                DLIB_CASSERT(have_same_dimensions(grad, gradient_input));

                const auto d = dest.host();
                const auto g = grad.host();
                const auto in = gradient_input.host();
                for (long n = 0; n < grad.num_samples(); ++n)
                {
                    const auto d2 = d + num_locations * num_channels * n;
                    const auto g2 = g + num_locations * num_channels * n;
                    const auto in2 = in + num_locations * num_channels * n;

                    if (mode == operation_mode::CHANNEL_WISE)
                    {
                        for (long i = 0; i < num_locations; ++i)
                        {
                            const auto d3 = d2 + i;
                            const auto g3 = g2 + i;
                            const auto in3 = in2 + i;
                            float sum = 0.0f;
                            for (long k = 0; k < num_channels; ++k)
                                sum += -d3[k * num_locations] * in3[k * num_locations];
                            if (is_same_object(gradient_input, grad))
                            {
                                for (long k = 0; k < num_channels; ++k)
                                    g3[k * num_locations] = d3[k * num_locations] * (sum + in3[k * num_locations]);
                            }
                            else
                            {
                                for (long k = 0; k < num_channels; ++k)
                                    g3[k * num_locations] += d3[k * num_locations] * (sum + in3[k * num_locations]);
                            }
                        }
                    }
                    else if (mode == operation_mode::PLANE_WISE)
                    {
                        for (long k = 0; k < num_channels; ++k)
                        {
                            const auto d_channel = d2 + k * num_locations;
                            const auto g_channel = g2 + k * num_locations;
                            const auto in_channel = in2 + k * num_locations;
                            for (long r = 0; r < grad.nr(); ++r)
                            {
                                float sum = 0.0f;
                                for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                    sum += -d_channel[idx] * in_channel[idx];
                                if (is_same_object(gradient_input, grad))
                                {
                                    for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                        g_channel[idx] = d_channel[idx] * (sum + in_channel[idx]);
                                }
                                else
                                {
                                    for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                        g_channel[idx] += d_channel[idx] * (sum + in_channel[idx]);
                                }
                            }
                        }
                    }
                }
            }